

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O1

UBool __thiscall icu_63::RuleBasedBreakIterator::BreakCache::populateFollowing(BreakCache *this)

{
  ushort uVar1;
  int32_t iVar2;
  RuleBasedBreakIterator *pRVar3;
  UBool UVar4;
  int32_t iVar5;
  uint uVar6;
  int iVar7;
  int32_t ruleStatusIdx;
  int32_t local_20;
  int32_t local_1c;
  
  iVar5 = this->fBoundaries[this->fEndBufIdx];
  uVar1 = this->fStatuses[this->fEndBufIdx];
  local_20 = 0;
  local_1c = 0;
  UVar4 = DictionaryCache::following(this->fBI->fDictionaryCache,iVar5,&local_20,&local_1c);
  if (UVar4 == '\0') {
    pRVar3 = this->fBI;
    pRVar3->fPosition = iVar5;
    local_20 = handleNext(pRVar3);
    if (local_20 == -1) {
      return '\0';
    }
    pRVar3 = this->fBI;
    local_1c = pRVar3->fRuleStatusIndex;
    if (pRVar3->fDictionaryCharCount != 0) {
      DictionaryCache::populateDictionary
                (pRVar3->fDictionaryCache,iVar5,local_20,(uint)uVar1,local_1c);
      UVar4 = DictionaryCache::following(this->fBI->fDictionaryCache,iVar5,&local_20,&local_1c);
      if (UVar4 != '\0') goto LAB_00322fc2;
    }
    uVar6 = this->fEndBufIdx + 1U & 0x7f;
    if (uVar6 == this->fStartBufIdx) {
      this->fStartBufIdx = this->fStartBufIdx + 6U & 0x7f;
    }
    this->fBoundaries[uVar6] = local_20;
    this->fStatuses[uVar6] = (uint16_t)local_1c;
    this->fEndBufIdx = uVar6;
    this->fBufIdx = uVar6;
    this->fTextIdx = local_20;
    iVar7 = 6;
    do {
      iVar5 = handleNext(this->fBI);
      if (iVar5 == -1) {
        return '\x01';
      }
      if (this->fBI->fDictionaryCharCount != 0) {
        return '\x01';
      }
      iVar2 = this->fBI->fRuleStatusIndex;
      uVar6 = this->fEndBufIdx + 1U & 0x7f;
      if (uVar6 == this->fStartBufIdx) {
        this->fStartBufIdx = this->fStartBufIdx + 6U & 0x7f;
      }
      this->fBoundaries[uVar6] = iVar5;
      this->fStatuses[uVar6] = (uint16_t)iVar2;
      this->fEndBufIdx = uVar6;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  else {
LAB_00322fc2:
    uVar6 = this->fEndBufIdx + 1U & 0x7f;
    if (uVar6 == this->fStartBufIdx) {
      this->fStartBufIdx = this->fStartBufIdx + 6U & 0x7f;
    }
    this->fBoundaries[uVar6] = local_20;
    this->fStatuses[uVar6] = (uint16_t)local_1c;
    this->fEndBufIdx = uVar6;
    this->fBufIdx = uVar6;
    this->fTextIdx = local_20;
  }
  return '\x01';
}

Assistant:

UBool RuleBasedBreakIterator::BreakCache::populateFollowing() {
    int32_t fromPosition = fBoundaries[fEndBufIdx];
    int32_t fromRuleStatusIdx = fStatuses[fEndBufIdx];
    int32_t pos = 0;
    int32_t ruleStatusIdx = 0;

    if (fBI->fDictionaryCache->following(fromPosition, &pos, &ruleStatusIdx)) {
        addFollowing(pos, ruleStatusIdx, UpdateCachePosition);
        return TRUE;
    }

    fBI->fPosition = fromPosition;
    pos = fBI->handleNext();
    if (pos == UBRK_DONE) {
        return FALSE;
    }

    ruleStatusIdx = fBI->fRuleStatusIndex;
    if (fBI->fDictionaryCharCount > 0) {
        // The text segment obtained from the rules includes dictionary characters.
        // Subdivide it, with subdivided results going into the dictionary cache.
        fBI->fDictionaryCache->populateDictionary(fromPosition, pos, fromRuleStatusIdx, ruleStatusIdx);
        if (fBI->fDictionaryCache->following(fromPosition, &pos, &ruleStatusIdx)) {
            addFollowing(pos, ruleStatusIdx, UpdateCachePosition);
            return TRUE;
            // TODO: may want to move a sizable chunk of dictionary cache to break cache at this point.
            //       But be careful with interactions with populateNear().
        }
    }

    // Rule based segment did not include dictionary characters.
    // Or, it did contain dictionary chars, but the dictionary segmenter didn't handle them,
    //    meaning that we didn't take the return, above.
    // Add its end point to the cache.
    addFollowing(pos, ruleStatusIdx, UpdateCachePosition);

    // Add several non-dictionary boundaries at this point, to optimize straight forward iteration.
    //    (subsequent calls to BreakIterator::next() will take the fast path, getting cached results.
    //
    for (int count=0; count<6; ++count) {
        pos = fBI->handleNext();
        if (pos == UBRK_DONE || fBI->fDictionaryCharCount > 0) {
            break;
        }
        addFollowing(pos, fBI->fRuleStatusIndex, RetainCachePosition);
    }

    return TRUE;
}